

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::PickerPrivate::drawItem
          (PickerPrivate *this,QPainter *p,QStyleOption *opt,int offset,QModelIndex *index)

{
  int iVar1;
  QModelIndex *pQVar2;
  int iVar3;
  QStyleOption *pQVar4;
  bool bVar5;
  Int IVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int awidth;
  QColor *c;
  bool local_139;
  undefined1 local_f8 [8];
  QRect tickRect;
  QFlags<Qt::ItemFlag> local_cc;
  Int local_c8 [4];
  QString local_b8;
  QString local_a0;
  undefined4 local_84;
  undefined1 local_80 [4];
  int flags;
  QRect r;
  QModelIndex local_50;
  QFlags<Qt::ItemFlag> local_38;
  Int local_34;
  QModelIndex *local_30;
  QModelIndex *index_local;
  QStyleOption *pQStack_20;
  int offset_local;
  QStyleOption *opt_local;
  QPainter *p_local;
  PickerPrivate *this_local;
  
  local_30 = index;
  index_local._4_4_ = offset;
  pQStack_20 = opt;
  opt_local = (QStyleOption *)p;
  p_local = (QPainter *)this;
  local_38.i = (Int)QModelIndex::flags(index);
  local_34 = (Int)QFlags<Qt::ItemFlag>::operator&(&local_38,ItemIsEnabled);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
  pQVar4 = opt_local;
  pQVar2 = local_30;
  if (IVar6 == 0) {
    c = QPalette::color((QPalette *)(pQStack_20 + 0x28),WindowText);
    join_0x00000010_0x00000000_ = lighterColor(c,0x4b);
    QPainter::setPen((QColor *)pQVar4);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&this->currentIndex);
    bVar5 = QModelIndex::operator!=(pQVar2,&local_50);
    pQVar4 = opt_local;
    if (bVar5) {
      QPalette::color((QPalette *)(pQStack_20 + 0x28),WindowText);
      QPainter::setPen((QColor *)pQVar4);
    }
    else {
      QPainter::setPen((QColor *)opt_local);
    }
  }
  iVar7 = QRect::x((QRect *)(pQStack_20 + 0x10));
  iVar3 = index_local._4_4_;
  iVar1 = this->itemSideMargin;
  iVar8 = QRect::width((QRect *)(pQStack_20 + 0x10));
  QRect::QRect((QRect *)local_80,iVar7 + iVar1,iVar3,iVar8 + this->itemSideMargin * -2,
               this->stringHeight);
  pQVar4 = opt_local;
  local_84 = 0x101;
  itemText(&local_b8,this,local_30);
  makeString(&local_a0,this,&local_b8,(QRect *)local_80,0x101,pQStack_20);
  QPainter::drawText((QRect *)pQVar4,(int)local_80,(QString *)0x101,(QRect *)&local_a0);
  QString::~QString(&local_a0);
  QString::~QString(&local_b8);
  local_cc.i = (Int)QModelIndex::flags(local_30);
  local_c8[0] = (Int)QFlags<Qt::ItemFlag>::operator&(&local_cc,ItemIsEnabled);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)local_c8);
  pQVar2 = local_30;
  local_139 = false;
  if (IVar6 != 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&tickRect.x2,&this->currentIndex);
    local_139 = QModelIndex::operator==(pQVar2,(QModelIndex *)&tickRect.x2);
  }
  if (local_139 != false) {
    iVar7 = QRect::x((QRect *)(pQStack_20 + 0x10));
    iVar1 = this->itemSideMargin;
    iVar8 = QFontMetrics::averageCharWidth();
    iVar9 = QFontMetrics::averageCharWidth();
    iVar3 = index_local._4_4_;
    awidth = QFontMetrics::averageCharWidth();
    QRect::QRect((QRect *)local_f8,((iVar7 + iVar1) - iVar8) - iVar9 / 2,iVar3,awidth,
                 this->stringHeight);
    drawTick(this,(QRect *)local_f8,(QPainter *)opt_local);
  }
  return;
}

Assistant:

void
PickerPrivate::drawItem( QPainter * p, const QStyleOption & opt, int offset,
	const QModelIndex & index )
{
	if( index.flags() & Qt::ItemIsEnabled )
	{
		if( index != currentIndex )
			p->setPen( opt.palette.color( QPalette::WindowText ) );
		else
			p->setPen( highlightColor );
	}
	else
		p->setPen( lighterColor( opt.palette.color( QPalette::WindowText ), 75 ) );

	const QRect r( opt.rect.x() + itemSideMargin, offset,
		opt.rect.width() - itemSideMargin * 2, stringHeight );

	const int flags = Qt::AlignLeft | Qt::TextSingleLine;

	p->drawText( r, flags,
		makeString( itemText( index ), r, flags, opt ) );

	if( index.flags() & Qt::ItemIsEnabled && index == currentIndex )
	{
		const QRect tickRect( opt.rect.x() + itemSideMargin -
				opt.fontMetrics.averageCharWidth() -
				opt.fontMetrics.averageCharWidth() / 2,
			offset,
			opt.fontMetrics.averageCharWidth(),
			stringHeight );

		drawTick( tickRect, p );
	}
}